

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void key_schedule_free(ptls_key_schedule_t *sched)

{
  st_ptls_hash_context_t *psVar1;
  ptls_hash_context_t **pppVar2;
  size_t sVar3;
  
  (*ptls_clear_memory)(sched->secret,0x40);
  if (sched->num_hashes != 0) {
    pppVar2 = &sched->hashes[0].ctx_outer;
    sVar3 = 0;
    do {
      (*pppVar2[-1]->final)(pppVar2[-1],(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
      psVar1 = *pppVar2;
      if (psVar1 != (st_ptls_hash_context_t *)0x0) {
        (*psVar1->final)(psVar1,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
      }
      sVar3 = sVar3 + 1;
      pppVar2 = pppVar2 + 3;
    } while (sVar3 != sched->num_hashes);
  }
  free(sched);
  return;
}

Assistant:

static void key_schedule_free(ptls_key_schedule_t *sched)
{
    size_t i;
    ptls_clear_memory(sched->secret, sizeof(sched->secret));
    for (i = 0; i != sched->num_hashes; ++i) {
        sched->hashes[i].ctx->final(sched->hashes[i].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
        if (sched->hashes[i].ctx_outer != NULL)
            sched->hashes[i].ctx_outer->final(sched->hashes[i].ctx_outer, NULL, PTLS_HASH_FINAL_MODE_FREE);
    }
    free(sched);
}